

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<QByteArray,char>,QByteArray>
          (QByteArray *a,QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  size_t __n;
  size_t __n_00;
  ulong uVar2;
  Data *pDVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  
  pDVar3 = (a->d).d;
  uVar5 = (a->d).size;
  uVar8 = (b->b).d.size + (b->a).a.d.size + uVar5 + 1;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar5);
    pDVar3 = (a->d).d;
    uVar5 = (a->d).size;
    uVar2 = uVar8;
    if (pDVar3 != (Data *)0x0) goto LAB_0010fbb2;
LAB_0010fbef:
    if (uVar2 < uVar5) {
      uVar2 = uVar5;
    }
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar2);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) {
      lVar4 = (pDVar3->super_QArrayData).alloc;
LAB_0010fc12:
      if (lVar4 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_0010fc1b;
    }
  }
  else {
LAB_0010fbb2:
    lVar4 = (pDVar3->super_QArrayData).alloc;
    pcVar7 = (a->d).ptr;
    lVar6 = ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar4;
    if ((long)((lVar6 - uVar5) - (long)pcVar7) < (long)uVar8) {
      uVar2 = lVar4 * 2;
      if (lVar4 * 2 < (long)uVar8) {
        uVar2 = uVar8;
      }
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - (long)pcVar7 < (long)uVar2)) goto LAB_0010fbef;
      goto LAB_0010fc12;
    }
LAB_0010fc1b:
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0010fc33;
  }
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_0010fc33:
  pcVar7 = (a->d).ptr + (a->d).size;
  __n = (b->a).a.d.size;
  if (__n != 0) {
    memcpy(pcVar7,(b->a).a.d.ptr,__n);
  }
  pcVar7[__n] = (b->a).b;
  __n_00 = (b->b).d.size;
  if (__n_00 != 0) {
    memcpy(pcVar7 + __n + 1,(b->b).d.ptr,__n_00);
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}